

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O0

void narrow_stripov_backprop(NarrowConv *nc,IRRef ref,int depth)

{
  byte bVar1;
  long lVar2;
  int *piVar3;
  uint *puVar4;
  long lVar5;
  BPropEntry *pBVar6;
  int in_EDX;
  uint in_ESI;
  long *in_RDI;
  NarrowIns *savesp;
  BPropEntry *bp;
  IRIns *ir;
  jit_State *J;
  long lVar7;
  
  lVar7 = *in_RDI;
  lVar5 = *(long *)(lVar7 + 0x10) + (ulong)in_ESI * 8;
  if (((*(char *)(lVar5 + 5) == '5') || (*(char *)(lVar5 + 5) == '6')) ||
     ((*(char *)(lVar5 + 5) == '7' && ((*(uint *)(in_RDI + 3) & 0xf000) == 0x1000)))) {
    pBVar6 = narrow_bpc_get((jit_State *)*in_RDI,(IRRef1)in_ESI,0);
    if (pBVar6 == (BPropEntry *)0x0) {
      in_EDX = in_EDX + 1;
      if ((in_EDX < 100) && ((ulong)in_RDI[1] < (ulong)in_RDI[2])) {
        lVar2 = in_RDI[1];
        narrow_stripov_backprop
                  ((NarrowConv *)CONCAT44(in_ESI,in_EDX),(IRRef)((ulong)lVar7 >> 0x20),(int)lVar7);
        if (((ulong)in_RDI[1] < (ulong)in_RDI[2]) &&
           (narrow_stripov_backprop
                      ((NarrowConv *)CONCAT44(in_ESI,in_EDX),(IRRef)((ulong)lVar7 >> 0x20),
                       (int)lVar7), (ulong)in_RDI[1] < (ulong)in_RDI[2])) {
          bVar1 = *(byte *)(lVar5 + 5);
          piVar3 = (int *)in_RDI[1];
          in_RDI[1] = (long)(piVar3 + 1);
          *piVar3 = ((bVar1 - 0xc) * 0x100 | 0x13) * 0x10000 + in_ESI;
          return;
        }
        in_RDI[1] = lVar2;
      }
    }
    else {
      in_ESI = (uint)pBVar6->val;
    }
  }
  puVar4 = (uint *)in_RDI[1];
  in_RDI[1] = (long)(puVar4 + 1);
  *puVar4 = in_ESI;
  return;
}

Assistant:

static void narrow_stripov_backprop(NarrowConv *nc, IRRef ref, int depth)
{
  jit_State *J = nc->J;
  IRIns *ir = IR(ref);
  if (ir->o == IR_ADDOV || ir->o == IR_SUBOV ||
      (ir->o == IR_MULOV && (nc->mode & IRCONV_CONVMASK) == IRCONV_ANY)) {
    BPropEntry *bp = narrow_bpc_get(nc->J, ref, IRCONV_TOBIT);
    if (bp) {
      ref = bp->val;
    } else if (++depth < NARROW_MAX_BACKPROP && nc->sp < nc->maxsp) {
      NarrowIns *savesp = nc->sp;
      narrow_stripov_backprop(nc, ir->op1, depth);
      if (nc->sp < nc->maxsp) {
	narrow_stripov_backprop(nc, ir->op2, depth);
	if (nc->sp < nc->maxsp) {
	  *nc->sp++ = NARROWINS(IRT(ir->o - IR_ADDOV + IR_ADD, IRT_INT), ref);
	  return;
	}
      }
      nc->sp = savesp;  /* Path too deep, need to backtrack. */
    }
  }
  *nc->sp++ = NARROWINS(NARROW_REF, ref);
}